

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void absl::lts_20250127::internal_any_invocable::
     LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0&>
               (TypeErasedState *state)

{
  anon_class_16_2_0454c2e6 *f_00;
  anon_class_16_2_0454c2e6 *f;
  TypeErasedState *state_local;
  
  f_00 = ObjectInLocalStorage<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0>
                   (state);
  InvokeR<void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0&,,void>
            (f_00);
  return;
}

Assistant:

ReturnType LocalInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(
      IsStoredLocally<RawT>::value,
      "Target object must be in local storage in order to be invoked from it.");

  auto& f = (ObjectInLocalStorage<RawT>)(state);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}